

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deep-lstm.cc
# Opt level: O0

Expression __thiscall
cnn::DeepLSTMBuilder::add_input_impl(DeepLSTMBuilder *this,int prev,Expression *x)

{
  reference pvVar1;
  int in_EDX;
  undefined8 extraout_RDX;
  long in_RSI;
  ComputationGraph *in_RDI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double __x;
  double __x_00;
  Expression EVar2;
  Expression ph_t;
  Expression i_ot;
  Expression i_aot;
  Expression i_crt;
  Expression i_nwt;
  Expression i_wt;
  Expression i_awt;
  Expression i_ft;
  Expression i_it;
  Expression i_ait;
  bool has_prev_state;
  Expression i_c_tm1;
  Expression i_h_tm1;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *vars;
  uint i;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> cc;
  Expression in;
  Expression *ot;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *ct;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *ht;
  initializer_list<cnn::expr::Expression> *in_stack_fffffffffffffa58;
  Expression *in_stack_fffffffffffffa60;
  allocator_type *in_stack_fffffffffffffa70;
  size_type in_stack_fffffffffffffa78;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *in_stack_fffffffffffffa80;
  Expression *in_stack_fffffffffffffa90;
  Expression *in_stack_fffffffffffffa98;
  byte local_509;
  expr local_478 [32];
  undefined1 local_458 [16];
  Expression local_448 [2];
  undefined1 *local_428;
  undefined8 local_420;
  Expression local_408;
  allocator_type local_3f8 [96];
  Expression *local_398;
  undefined8 local_390;
  expr local_328 [16];
  undefined1 local_318 [16];
  Expression local_308 [2];
  undefined1 *local_2e8;
  undefined8 local_2e0;
  undefined1 local_2c8 [80];
  undefined1 *local_278;
  undefined8 local_270;
  undefined1 local_228 [48];
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1d8 [112];
  undefined1 *local_168;
  undefined8 local_160;
  byte local_131;
  reference local_110;
  undefined1 local_108 [32];
  undefined1 *local_e8;
  undefined8 local_e0;
  uint local_c8;
  vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> local_c0;
  reference local_98;
  reference local_90;
  reference local_88;
  int local_14;
  
  local_14 = in_EDX;
  std::allocator<cnn::expr::Expression>::allocator((allocator<cnn::expr::Expression> *)0x5d21fb);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::push_back((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               *)in_stack_fffffffffffffa60,(value_type *)in_stack_fffffffffffffa58);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_fffffffffffffa70);
  std::allocator<cnn::expr::Expression>::~allocator((allocator<cnn::expr::Expression> *)0x5d224b);
  std::allocator<cnn::expr::Expression>::allocator((allocator<cnn::expr::Expression> *)0x5d2285);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
  std::
  vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
  ::push_back((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               *)in_stack_fffffffffffffa60,(value_type *)in_stack_fffffffffffffa58);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_fffffffffffffa70);
  std::allocator<cnn::expr::Expression>::~allocator((allocator<cnn::expr::Expression> *)0x5d22d5);
  cnn::expr::Expression::Expression((Expression *)0x5d2300);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::push_back
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_fffffffffffffa60,(value_type *)in_stack_fffffffffffffa58);
  local_88 = std::
             vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
             ::back((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     *)in_stack_fffffffffffffa60);
  local_90 = std::
             vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
             ::back((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                     *)in_stack_fffffffffffffa60);
  local_98 = std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::back
                       ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                        in_stack_fffffffffffffa60);
  cnn::expr::Expression::Expression
            (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
  std::allocator<cnn::expr::Expression>::allocator((allocator<cnn::expr::Expression> *)0x5d239c);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::vector
            (in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
  std::allocator<cnn::expr::Expression>::~allocator((allocator<cnn::expr::Expression> *)0x5d23c8);
  for (local_c8 = 0; local_c8 < *(uint *)(in_RSI + 0xd8); local_c8 = local_c8 + 1) {
    if (local_c8 != 0) {
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      local_e0 = 2;
      local_e8 = local_108;
      cnn::expr::concatenate(in_stack_fffffffffffffa58);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
    }
    local_110 = std::
                vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                ::operator[]((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                              *)(in_RSI + 0x40),(ulong)local_c8);
    cnn::expr::Expression::Expression((Expression *)0x5d2588);
    cnn::expr::Expression::Expression((Expression *)0x5d2597);
    local_509 = 1;
    if (local_14 < 0) {
      local_509 = *(byte *)(in_RSI + 0xa0);
    }
    local_131 = local_509 & 1;
    if (local_14 < 0) {
      if ((*(byte *)(in_RSI + 0xa0) & 1) != 0) {
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                   (in_RSI + 0xa8),(ulong)local_c8);
        cnn::expr::Expression::operator=
                  (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
        std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                  ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
                   (in_RSI + 0xc0),(ulong)local_c8);
        cnn::expr::Expression::operator=
                  (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      }
    }
    else {
      pvVar1 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[]((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                             *)(in_RSI + 0x58),(long)local_14);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (pvVar1,(ulong)local_c8);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      pvVar1 = std::
               vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
               ::operator[]((vector<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>,_std::allocator<std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>_>_>
                             *)(in_RSI + 0x70),(long)local_14);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (pvVar1,(ulong)local_c8);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
    }
    cnn::expr::Expression::Expression((Expression *)0x5d26c9);
    if ((local_131 & 1) == 0) {
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_110,3);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_110,0);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      local_1f0 = 3;
      local_1f8 = local_228;
      cnn::expr::affine_transform(in_stack_fffffffffffffa58);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
    }
    else {
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_110,3);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_110,0);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_110,1);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_110,2);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      local_160 = 7;
      local_168 = local_1d8;
      cnn::expr::affine_transform(in_stack_fffffffffffffa58);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
    }
    cnn::expr::logistic(in_stack_fffffffffffffa98);
    cnn::expr::operator-((real)((ulong)in_stack_fffffffffffffa98 >> 0x20),in_stack_fffffffffffffa90)
    ;
    cnn::expr::Expression::Expression((Expression *)0x5d290d);
    if ((local_131 & 1) == 0) {
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_110,10);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      in_stack_fffffffffffffa98 = local_308;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_110,8);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      local_2e0 = 3;
      local_2e8 = local_318;
      cnn::expr::affine_transform(in_stack_fffffffffffffa58);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      __x = extraout_XMM0_Qa_00;
    }
    else {
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_110,10);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_110,8);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_110,9);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      local_270 = 5;
      local_278 = local_2c8;
      cnn::expr::affine_transform(in_stack_fffffffffffffa58);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      __x = extraout_XMM0_Qa;
    }
    cnn::expr::tanh(local_328,__x);
    if ((local_131 & 1) == 0) {
      cnn::expr::cwise_multiply(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_90,(ulong)local_c8);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
    }
    else {
      cnn::expr::cwise_multiply(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
      cnn::expr::cwise_multiply(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
      cnn::expr::operator+(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_90,(ulong)local_c8);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
    }
    cnn::expr::Expression::Expression((Expression *)0x5d2bb9);
    if ((local_131 & 1) == 0) {
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_110,7);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      in_stack_fffffffffffffa60 = local_448;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_110,4);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      local_420 = 3;
      local_428 = local_458;
      cnn::expr::affine_transform(in_stack_fffffffffffffa58);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
    }
    else {
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_110,7);
      in_stack_fffffffffffffa90 = &local_408;
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      in_stack_fffffffffffffa70 = local_3f8;
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_110,4);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_110,5);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_110,6);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
                (local_90,(ulong)local_c8);
      cnn::expr::Expression::Expression
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
      local_390 = 7;
      local_398 = in_stack_fffffffffffffa90;
      cnn::expr::affine_transform(in_stack_fffffffffffffa58);
      cnn::expr::Expression::operator=
                (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
    }
    cnn::expr::logistic(in_stack_fffffffffffffa98);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (local_90,(ulong)local_c8);
    cnn::expr::tanh(local_478,__x_00);
    cnn::expr::cwise_multiply(in_stack_fffffffffffffa98,in_stack_fffffffffffffa90);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (local_88,(ulong)local_c8);
    cnn::expr::Expression::operator=
              (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
    cnn::expr::Expression::operator=
              (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
    std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::operator[]
              (&local_c0,(ulong)local_c8);
    cnn::expr::Expression::operator=
              (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
  }
  cnn::expr::concatenate<std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_fffffffffffffa58);
  cnn::expr::Expression::operator=
            (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
  cnn::expr::Expression::Expression
            (in_stack_fffffffffffffa60,(Expression *)in_stack_fffffffffffffa58);
  std::vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>::~vector
            ((vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *)
             in_stack_fffffffffffffa70);
  EVar2._8_8_ = extraout_RDX;
  EVar2.pg = in_RDI;
  return EVar2;
}

Assistant:

Expression DeepLSTMBuilder::add_input_impl(int prev, const Expression& x) {
  h.push_back(vector<Expression>(layers));
  c.push_back(vector<Expression>(layers));
  o.push_back(Expression());
  vector<Expression>& ht = h.back();
  vector<Expression>& ct = c.back();
  Expression& ot = o.back();
  Expression in = x;
  vector<Expression> cc(layers);
  for (unsigned i = 0; i < layers; ++i) {
    if (i > 0)
      in = concatenate({in, x});
    const vector<Expression>& vars = param_vars[i];
    Expression i_h_tm1, i_c_tm1;
    bool has_prev_state = (prev >= 0 || has_initial_state);
    if (prev < 0) {
      if (has_initial_state) {
        // intial value for h and c at timestep 0 in layer i
        // defaults to zero matrix input if not set in add_parameter_edges
        i_h_tm1 = h0[i];
        i_c_tm1 = c0[i];
      }
    } else {  // t > 0
      i_h_tm1 = h[prev][i];
      i_c_tm1 = c[prev][i];
    }
    // input
    Expression i_ait;
    if (has_prev_state)
//      i_ait = vars[BI] + vars[X2I] * in + vars[H2I]*i_h_tm1 + vars[C2I] * i_c_tm1;
      i_ait = affine_transform({vars[BI], vars[X2I], in, vars[H2I], i_h_tm1, vars[C2I], i_c_tm1});
    else
//      i_ait = vars[BI] + vars[X2I] * in;
      i_ait = affine_transform({vars[BI], vars[X2I], in});
    Expression i_it = logistic(i_ait);
    // forget
    Expression i_ft = 1.f - i_it;
    // write memory cell
    Expression i_awt;
    if (has_prev_state)
//      i_awt = vars[BC] + vars[X2C] * in + vars[H2C]*i_h_tm1;
      i_awt = affine_transform({vars[BC], vars[X2C], in, vars[H2C], i_h_tm1});
    else
//      i_awt = vars[BC] + vars[X2C] * in;
      i_awt = affine_transform({vars[BC], vars[X2C], in});
    Expression i_wt = tanh(i_awt);
    // output
    if (has_prev_state) {
      Expression i_nwt = cwise_multiply(i_it,i_wt);
      Expression i_crt = cwise_multiply(i_ft,i_c_tm1);
      ct[i] = i_crt + i_nwt;
    } else {
      ct[i] = cwise_multiply(i_it,i_wt);
    }

    Expression i_aot;
    if (has_prev_state)
//      i_aot = vars[BO] + vars[X2O] * in + vars[H2O] * i_h_tm1 + vars[C2O] * ct[i];
      i_aot = affine_transform({vars[BO], vars[X2O], in, vars[H2O], i_h_tm1, vars[C2O], ct[i]});
    else
//      i_aot = vars[BO] + vars[X2O] * in;
      i_aot = affine_transform({vars[BO], vars[X2O], in});
    Expression i_ot = logistic(i_aot);
    Expression ph_t = tanh(ct[i]);
    in = ht[i] = cwise_multiply(i_ot,ph_t);
    cc[i] = in;
  }
  ot = concatenate(cc);
  return ot;
}